

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::WrapperOneofFieldGenerator::GenerateSerializationCode
          (WrapperOneofFieldGenerator *this,Printer *printer,bool use_write_context)

{
  char *text;
  undefined7 in_register_00000011;
  
  text = 
  "if ($has_property_check$) {\n  _oneof_$name$_codec.WriteTagAndValue(output, ($type_name$) $oneof_name$_);\n}\n"
  ;
  if ((int)CONCAT71(in_register_00000011,use_write_context) != 0) {
    text = 
    "if ($has_property_check$) {\n  _oneof_$name$_codec.WriteTagAndValue(ref output, ($type_name$) $oneof_name$_);\n}\n"
    ;
  }
  io::Printer::Print(printer,&(this->super_WrapperFieldGenerator).super_FieldGeneratorBase.
                              variables_,text);
  return;
}

Assistant:

void WrapperOneofFieldGenerator::GenerateSerializationCode(io::Printer* printer, bool use_write_context) {
  // TODO: I suspect this is wrong...
  printer->Print(
    variables_,
    use_write_context
    ? "if ($has_property_check$) {\n"
      "  _oneof_$name$_codec.WriteTagAndValue(ref output, ($type_name$) $oneof_name$_);\n"
      "}\n"
    : "if ($has_property_check$) {\n"
      "  _oneof_$name$_codec.WriteTagAndValue(output, ($type_name$) $oneof_name$_);\n"
      "}\n");
}